

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall Enumerated::Decode(Enumerated *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  length_error *this_00;
  size_t local_40;
  size_t cbPrefix;
  size_t size;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  Enumerated *this_local;
  
  cbPrefix = 0;
  local_40 = 0;
  size = (size_t)cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)this;
  bVar1 = CheckDecode(pIn,cbIn,Enumerated,&cbPrefix,&local_40);
  if (bVar1) {
    if (local_40 + cbPrefix != 3) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"Incorrect decode");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    this->value = *(uchar *)(cbIn_local + 2);
    *(undefined8 *)size = 3;
    this_local._7_1_ = true;
  }
  else {
    *(undefined8 *)size = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool Decode(const unsigned char* pIn, size_t cbIn, size_t& cbUsed) override
	{
		size_t size = 0;
		size_t cbPrefix = 0;
		if (!CheckDecode(pIn, cbIn, DerType::Enumerated, size, cbPrefix))
		{
			cbUsed = 0;
			return false;
		}

		// Now check specifics for this type
		if (cbPrefix + size != 3)
			throw std::length_error("Incorrect decode");

		value = pIn[2];
		cbUsed = 3;
		return true;
	}